

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_index_type.h
# Opt level: O3

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::NewActiveCornerReached
          (MeshEdgebreakerTraversalPredictiveDecoder *this,CornerIndex corner)

{
  ulong uVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  int iVar5;
  CornerTable *pCVar6;
  pointer piVar7;
  ulong uVar8;
  
  if (corner.value_ == 0xffffffff) {
    uVar4 = 0xffffffff;
    uVar2 = 0xffffffff;
  }
  else {
    uVar4 = corner.value_ - 2;
    if (0x55555555 < corner.value_ * -0x55555555 + 0xaaaaaaab) {
      uVar4 = corner.value_ + 1;
    }
    if (corner.value_ * -0x55555555 < 0x55555556) {
      uVar2 = corner.value_ + 2;
    }
    else {
      uVar2 = corner.value_ - 1;
    }
  }
  uVar1 = 0xffffffff;
  iVar5 = this->last_symbol_;
  switch(iVar5) {
  case 0:
  case 1:
    pCVar6 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (uVar4 != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4].value_;
    }
    piVar7 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = piVar7 + uVar8;
    *piVar3 = *piVar3 + 1;
    uVar8 = 0xffffffff;
    if (uVar2 != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar2].value_;
    }
    piVar3 = piVar7 + uVar8;
    break;
  default:
    goto switchD_0012533c_caseD_2;
  case 3:
    pCVar6 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar7 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7[uVar8] = piVar7[uVar8] + 1;
    uVar8 = 0xffffffff;
    if (uVar4 != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4].value_;
    }
    piVar7[uVar8] = piVar7[uVar8] + 2;
    uVar8 = 0xffffffff;
    if (uVar2 != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar2].value_;
    }
    piVar3 = piVar7 + uVar8;
    break;
  case 5:
    pCVar6 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar7 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7[uVar8] = piVar7[uVar8] + 1;
    uVar8 = 0xffffffff;
    if (uVar4 != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4].value_;
    }
    piVar7[uVar8] = piVar7[uVar8] + 1;
    goto LAB_00125461;
  case 7:
    pCVar6 = this->corner_table_;
    uVar8 = 0xffffffff;
    if (corner.value_ != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[corner.value_].value_;
    }
    piVar7 = (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7[uVar8] = piVar7[uVar8] + 2;
    uVar8 = 0xffffffff;
    if (uVar4 != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4].value_;
    }
    piVar7[uVar8] = piVar7[uVar8] + 2;
LAB_00125461:
    uVar8 = 0xffffffff;
    if (uVar2 != 0xffffffff) {
      uVar8 = (ulong)(pCVar6->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar2].value_;
    }
    piVar3 = piVar7 + uVar8;
    iVar5 = 2;
    goto LAB_0012547c;
  }
  iVar5 = 1;
LAB_0012547c:
  *piVar3 = *piVar3 + iVar5;
  iVar5 = this->last_symbol_;
switchD_0012533c_caseD_2:
  if ((iVar5 != 5) && (iVar5 != 0)) {
    this->predicted_symbol_ = -1;
    return;
  }
  if (corner.value_ != 0xffffffff) {
    uVar4 = corner.value_ - 2;
    if (0x55555555 < (corner.value_ + 1) * -0x55555555) {
      uVar4 = corner.value_ + 1;
    }
    if (uVar4 != 0xffffffff) {
      uVar1 = (ulong)(this->corner_table_->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar4].value_;
    }
  }
  if ((this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] < 6) {
    this->predicted_symbol_ = 5;
    return;
  }
  this->predicted_symbol_ = 0;
  return;
}

Assistant:

constexpr bool operator==(const IndexType &i) const {
    return value_ == i.value_;
  }